

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O2

int get_xwinprop(Window wnd,Atom prop,long max_length,unsigned_long *nitems,unsigned_long **data)

{
  int iVar1;
  int format;
  Atom actual;
  unsigned_long bytes_after;
  
  iVar1 = XGetWindowProperty(fl_display,wnd,prop,0,0x40,0,0,&actual,&format,max_length,&bytes_after,
                             nitems);
  if (iVar1 == 0) {
    iVar1 = -(uint)(format != 0x20 || actual == 0);
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int get_xwinprop(Window wnd, Atom prop, long max_length,
                        unsigned long *nitems, unsigned long **data) {
  Atom actual;
  int format;
  unsigned long bytes_after;
  
  if (Success != XGetWindowProperty(fl_display, wnd, prop, 0, max_length, 
                                    False, AnyPropertyType, &actual, &format, 
                                    nitems, &bytes_after, (unsigned char**)data)) {
    return -1;
  }

  if (actual == None || format != 32) {
    return -1;
  }

  return 0;
}